

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O0

REF_STATUS ref_adapt_min_sliver_angle(REF_GRID ref_grid,REF_INT *nodes,REF_DBL *angle)

{
  REF_INT node_00;
  REF_INT node1_00;
  REF_INT node1_01;
  uint uVar1;
  double __x;
  double dVar2;
  double dVar3;
  double local_c8;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dot;
  REF_DBL dx2 [3];
  double local_78;
  REF_DBL dx1 [3];
  int local_54;
  int local_50;
  REF_INT node2;
  REF_INT node1;
  REF_INT node;
  REF_INT cell_node;
  REF_INT i;
  REF_BOOL has_side;
  REF_BOOL geom_node;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_DBL *angle_local;
  REF_INT *nodes_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->geom;
  _has_side = ref_grid->node;
  node1 = 0;
  ref_geom = (REF_GEOM)angle;
  angle_local = (REF_DBL *)nodes;
  nodes_local = (REF_INT *)ref_grid;
  while( true ) {
    if (2 < node1) {
      return 0;
    }
    node_00 = *(REF_INT *)((long)angle_local + (long)node1 * 4);
    uVar1 = ref_geom_is_a((REF_GEOM)ref_node,node_00,0,&i);
    if (uVar1 != 0) break;
    if (i != 0) {
      local_50 = node1 + 1;
      local_54 = node1 + 2;
      if (2 < local_50) {
        local_50 = node1 + -2;
      }
      if (2 < local_54) {
        local_54 = node1 + -1;
      }
      node1_00 = *(REF_INT *)((long)angle_local + (long)local_50 * 4);
      node1_01 = *(REF_INT *)((long)angle_local + (long)local_54 * 4);
      uVar1 = ref_cell_has_side(*(REF_CELL *)(nodes_local + 4),node_00,node1_00,&cell_node);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",500
               ,"ref_adapt_min_sliver_angle",(ulong)uVar1,"has edge node-node1");
        return uVar1;
      }
      if (cell_node != 0) {
        uVar1 = ref_cell_has_side(*(REF_CELL *)(nodes_local + 4),node_00,node1_01,&cell_node);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x1f7,"ref_adapt_min_sliver_angle",(ulong)uVar1,"has edge node-node2");
          return uVar1;
        }
        if (cell_node != 0) {
          for (node = 0; node < 3; node = node + 1) {
            dx1[(long)node + -1] =
                 _has_side->real[node + node1_00 * 0xf] - _has_side->real[node + node_00 * 0xf];
            dx2[(long)node + -1] =
                 _has_side->real[node + node1_01 * 0xf] - _has_side->real[node + node_00 * 0xf];
          }
          uVar1 = ref_math_normalize(&local_78);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0x1ff,"ref_adapt_min_sliver_angle",(ulong)uVar1,"dx1");
            return uVar1;
          }
          uVar1 = ref_math_normalize(&dot);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0x200,"ref_adapt_min_sliver_angle",(ulong)uVar1,"dx2");
            return uVar1;
          }
          __x = dx1[1] * dx2[1] + local_78 * dot + dx1[0] * dx2[0];
          dVar3 = *(double *)ref_geom;
          dVar2 = acos(__x);
          if ((dVar2 * 180.0) / 3.14159265358979 <= dVar3) {
            dVar3 = acos(__x);
            local_c8 = (dVar3 * 180.0) / 3.14159265358979;
          }
          else {
            local_c8 = *(double *)ref_geom;
          }
          *(double *)ref_geom = local_c8;
        }
      }
    }
    node1 = node1 + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x1eb,
         "ref_adapt_min_sliver_angle",(ulong)uVar1,"geom node check");
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_adapt_min_sliver_angle(REF_GRID ref_grid,
                                                     REF_INT *nodes,
                                                     REF_DBL *angle) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_BOOL geom_node, has_side;
  REF_INT i, cell_node, node, node1, node2;

  REF_DBL dx1[3], dx2[3], dot;

  for (cell_node = 0; cell_node < 3; cell_node++) {
    node = nodes[cell_node];
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node),
        "geom node check");
    if (geom_node) {
      node1 = cell_node + 1;
      node2 = cell_node + 2;
      if (node1 > 2) node1 -= 3;
      if (node2 > 2) node2 -= 3;
      node1 = nodes[node1];
      node2 = nodes[node2];
      RSS(ref_cell_has_side(ref_grid_edg(ref_grid), node, node1, &has_side),
          "has edge node-node1");
      if (!has_side) continue;
      RSS(ref_cell_has_side(ref_grid_edg(ref_grid), node, node2, &has_side),
          "has edge node-node2");
      if (!has_side) continue;
      for (i = 0; i < 3; i++) {
        dx1[i] =
            ref_node_xyz(ref_node, i, node1) - ref_node_xyz(ref_node, i, node);
        dx2[i] =
            ref_node_xyz(ref_node, i, node2) - ref_node_xyz(ref_node, i, node);
      }
      RSS(ref_math_normalize(dx1), "dx1");
      RSS(ref_math_normalize(dx2), "dx2");
      dot = ref_math_dot(dx1, dx2);
      *angle = MIN(*angle, ref_math_in_degrees(acos(dot)));
    }
  }

  return REF_SUCCESS;
}